

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O0

oonf_layer2_data *
oonf_layer2_neigh_get_data(oonf_layer2_neigh *l2neigh,oonf_layer2_neighbor_index idx)

{
  bool bVar1;
  oonf_layer2_data *data;
  oonf_layer2_neighbor_index idx_local;
  oonf_layer2_neigh *l2neigh_local;
  
  l2neigh_local = (oonf_layer2_neigh *)(l2neigh->data + idx);
  bVar1 = false;
  if (*(long *)(((oonf_layer2_value *)&l2neigh_local->key)->field3 + 0x20) != 0) {
    bVar1 = *(long *)(((oonf_layer2_value *)&l2neigh_local->key)->field3 + 0x18) != 0;
  }
  if (!bVar1) {
    l2neigh_local = (oonf_layer2_neigh *)(l2neigh->network->neighdata + idx);
    bVar1 = false;
    if (*(long *)(((oonf_layer2_value *)&l2neigh_local->key)->field3 + 0x20) != 0) {
      bVar1 = *(long *)(((oonf_layer2_value *)&l2neigh_local->key)->field3 + 0x18) != 0;
    }
    if (!bVar1) {
      l2neigh_local = (oonf_layer2_neigh *)0x0;
    }
  }
  return (oonf_layer2_data *)l2neigh_local;
}

Assistant:

struct oonf_layer2_data *
oonf_layer2_neigh_get_data(struct oonf_layer2_neigh *l2neigh, enum oonf_layer2_neighbor_index idx) {
  struct oonf_layer2_data *data;

  data = &l2neigh->data[idx];
  if (oonf_layer2_data_has_value(data)) {
    return data;
  }

  /* look for network specific default */
  data = &l2neigh->network->neighdata[idx];
  if (oonf_layer2_data_has_value(data)) {
    return data;
  }
  return NULL;
}